

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transition.cc
# Opt level: O2

size_t tchecker::ta::shared_hash_value(transition_t *t)

{
  size_t h;
  size_t local_18;
  
  local_18 = syncprod::shared_hash_value(&t->super_transition_t);
  boost::
  hash_combine<std::vector<tchecker::clock_constraint_t,std::allocator<tchecker::clock_constraint_t>>>
            (&local_18,&t->_src_invariant);
  boost::
  hash_combine<std::vector<tchecker::clock_constraint_t,std::allocator<tchecker::clock_constraint_t>>>
            (&local_18,&t->_guard);
  boost::hash_combine<std::vector<tchecker::clock_reset_t,std::allocator<tchecker::clock_reset_t>>>
            (&local_18,&t->_reset);
  boost::
  hash_combine<std::vector<tchecker::clock_constraint_t,std::allocator<tchecker::clock_constraint_t>>>
            (&local_18,&t->_tgt_invariant);
  return local_18;
}

Assistant:

std::size_t shared_hash_value(tchecker::ta::transition_t const & t)
{
  std::size_t h = tchecker::syncprod::shared_hash_value(t);
  boost::hash_combine(h, t.src_invariant_container());
  boost::hash_combine(h, t.guard_container());
  boost::hash_combine(h, t.reset_container());
  boost::hash_combine(h, t.tgt_invariant_container());
  return h;
}